

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O1

void __thiscall google::protobuf::internal::ThreadSafeArena::CleanupList(ThreadSafeArena *this)

{
  SerialArenaChunk *pSVar1;
  SerialArena *pSVar2;
  undefined8 *puVar3;
  ulong uVar4;
  SerialArenaChunk *pSVar5;
  undefined8 *puVar6;
  void *pvVar7;
  string *psVar8;
  string *extraout_RAX;
  undefined1 *puVar9;
  long lVar10;
  GetDeallocator deallocator;
  Span<std::atomic<google::protobuf::internal::SerialArena_*>_> SVar11;
  SizedPtr SVar12;
  undefined1 auStack_88 [16];
  ThreadSafeArena *pTStack_78;
  long lStack_70;
  SerialArena *pSStack_68;
  char *pcStack_60;
  pointer paStack_58;
  SerialArenaChunk *pSStack_50;
  undefined1 local_40 [16];
  
  pSVar5 = (this->head_)._M_b._M_p;
  do {
    do {
      if (((ulong)pSVar5 & 7) != 0) {
        pSStack_50 = (SerialArenaChunk *)0x1c48b8;
        __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/container/internal/layout.h"
                      ,0x1fe,
                      "CopyConst<Char, ElementType<N>> *absl::container_internal::internal_layout::LayoutImpl<std::tuple<google::protobuf::internal::SerialArenaChunkHeader, std::atomic<void *>, std::atomic<google::protobuf::internal::SerialArena *>>, std::integer_sequence<unsigned long>, std::integer_sequence<unsigned long>, std::integer_sequence<unsigned long>, std::integer_sequence<unsigned long, 0>>::Pointer(Char *) const [Elements = std::tuple<google::protobuf::internal::SerialArenaChunkHeader, std::atomic<void *>, std::atomic<google::protobuf::internal::SerialArena *>>, StaticSizeSeq = std::integer_sequence<unsigned long>, RuntimeSizeSeq = std::integer_sequence<unsigned long>, SizeSeq = std::integer_sequence<unsigned long>, OffsetSeq = std::integer_sequence<unsigned long, 0>, N = 0UL, Char = const char]"
                     );
      }
      if (*(int *)(pSVar5 + 8) == 0) {
        cleanup::ChunkList::Cleanup(&(this->first_arena_).cleanup_list_,&this->first_arena_);
        return;
      }
      pSVar1 = *(SerialArenaChunk **)pSVar5;
      pSStack_50 = (SerialArenaChunk *)0x1c484e;
      SVar11 = SerialArenaChunk::arenas(pSVar5);
      pSVar5 = pSVar1;
    } while (SVar11.len_ == 0);
    lVar10 = SVar11.len_ << 3;
    do {
      pSVar2 = *(SerialArena **)((long)&SVar11.ptr_[-1]._M_b._M_p + lVar10);
      if (pSVar2 == (SerialArena *)0x0) {
        pSStack_50 = (SerialArenaChunk *)0x1c488e;
        psVar8 = absl::lts_20240722::log_internal::MakeCheckOpString<void_const*,void_const*>
                           ((void *)0x0,(void *)0x0,"serial != nullptr");
      }
      else {
        psVar8 = (string *)0x0;
      }
      if (psVar8 != (string *)0x0) {
        puVar9 = local_40;
        pSStack_50 = (SerialArenaChunk *)0x1c48e3;
        CleanupList();
        pcStack_60 = "serial != nullptr";
        if ((*(ulong *)(puVar9 + 8) & 0xfffffffffffffff8) == 0) {
          deallocator.dealloc_ = (_func_void_void_ptr_size_t *)0x0;
        }
        else {
          deallocator.dealloc_ =
               *(_func_void_void_ptr_size_t **)
                ((*(ulong *)(puVar9 + 8) & 0xfffffffffffffff8) + 0x18);
        }
        pSStack_50 = pSVar1;
        pSStack_68 = pSVar2;
        pSVar5 = *(SerialArenaChunk **)(puVar9 + 0x20);
        pTStack_78 = this;
        paStack_58 = SVar11.ptr_;
        lStack_70 = lVar10;
        goto joined_r0x001c4912;
      }
      pSStack_50 = (SerialArenaChunk *)0x1c487a;
      cleanup::ChunkList::Cleanup(&pSVar2->cleanup_list_,pSVar2);
      lVar10 = lVar10 + -8;
    } while (lVar10 != 0);
  } while( true );
joined_r0x001c4912:
  if (((ulong)pSVar5 & 7) != 0) {
    __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/container/internal/layout.h"
                  ,0x1fe,
                  "CopyConst<Char, ElementType<N>> *absl::container_internal::internal_layout::LayoutImpl<std::tuple<google::protobuf::internal::SerialArenaChunkHeader, std::atomic<void *>, std::atomic<google::protobuf::internal::SerialArena *>>, std::integer_sequence<unsigned long>, std::integer_sequence<unsigned long>, std::integer_sequence<unsigned long>, std::integer_sequence<unsigned long, 0>>::Pointer(Char *) const [Elements = std::tuple<google::protobuf::internal::SerialArenaChunkHeader, std::atomic<void *>, std::atomic<google::protobuf::internal::SerialArena *>>, StaticSizeSeq = std::integer_sequence<unsigned long>, RuntimeSizeSeq = std::integer_sequence<unsigned long>, SizeSeq = std::integer_sequence<unsigned long>, OffsetSeq = std::integer_sequence<unsigned long, 0>, N = 0UL, Char = const char]"
                 );
  }
  if (*(int *)(pSVar5 + 8) == 0) {
    SerialArena::Free<google::protobuf::internal::(anonymous_namespace)::GetDeallocator>
              ((SerialArena *)(puVar9 + 0x30),deallocator);
    return;
  }
  pSVar1 = *(SerialArenaChunk **)pSVar5;
  SVar11 = SerialArenaChunk::arenas(pSVar5);
  if (SVar11.len_ != 0) {
    lVar10 = SVar11.len_ << 3;
    do {
      pSVar2 = *(SerialArena **)((long)&SVar11.ptr_[-1]._M_b._M_p + lVar10);
      if (pSVar2 == (SerialArena *)0x0) {
        psVar8 = absl::lts_20240722::log_internal::MakeCheckOpString<void_const*,void_const*>
                           ((void *)0x0,(void *)0x0,"serial != nullptr");
      }
      else {
        psVar8 = (string *)0x0;
      }
      if (psVar8 != (string *)0x0) {
        Free();
        psVar8 = extraout_RAX;
LAB_001c4a2c:
        puVar9 = auStack_88;
        Free();
        if (*(StringBlock **)(puVar9 + 0x38) != (StringBlock *)0x0) {
          SerialArena::FreeStringBlocks(*(StringBlock **)(puVar9 + 0x38),*(size_t *)(puVar9 + 0x40))
          ;
        }
        puVar3 = *(undefined8 **)(puVar9 + 0x48);
        uVar4 = puVar3[1];
        for (puVar6 = (undefined8 *)*puVar3; puVar6 != (undefined8 *)0x0;
            puVar6 = (undefined8 *)*puVar6) {
          if (psVar8 == (string *)0x0) {
            operator_delete(puVar3,uVar4);
          }
          else {
            (*(code *)psVar8)();
          }
          uVar4 = puVar6[1];
          puVar3 = puVar6;
        }
        return;
      }
      SVar12 = SerialArena::Free<google::protobuf::internal::(anonymous_namespace)::GetDeallocator>
                         (pSVar2,deallocator);
      pvVar7 = SVar12.p;
      if (pvVar7 == (void *)0x0) {
        psVar8 = absl::lts_20240722::log_internal::MakeCheckOpString<void_const*,void_const*>
                           ((void *)0x0,(void *)0x0,"mem.p != nullptr");
      }
      else {
        psVar8 = (string *)0x0;
      }
      if (psVar8 != (string *)0x0) goto LAB_001c4a2c;
      if (deallocator.dealloc_ == (_func_void_void_ptr_size_t *)0x0) {
        operator_delete(pvVar7,SVar12.n);
      }
      else {
        (*deallocator.dealloc_)(pvVar7,SVar12.n);
      }
      lVar10 = lVar10 + -8;
    } while (lVar10 != 0);
  }
  operator_delete(pSVar5,(ulong)*(uint *)(pSVar5 + 8) * 0x10 + 0x10);
  pSVar5 = pSVar1;
  goto joined_r0x001c4912;
}

Assistant:

void ThreadSafeArena::CleanupList() {
#ifdef PROTOBUF_ASAN
  UnpoisonAllArenaBlocks();
#endif

  WalkSerialArenaChunk([](SerialArenaChunk* chunk) {
    absl::Span<std::atomic<SerialArena*>> span = chunk->arenas();
    // Walks arenas backward to handle the first serial arena the last.
    // Destroying in reverse-order to the construction is often assumed by users
    // and required not to break inter-object dependencies. (b/247560530)
    for (auto it = span.rbegin(); it != span.rend(); ++it) {
      SerialArena* serial = it->load(std::memory_order_relaxed);
      ABSL_DCHECK_NE(serial, nullptr);
      serial->CleanupList();
    }
  });
  // First arena must be cleaned up last. (b/247560530)
  first_arena_.CleanupList();
}